

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cxx
# Opt level: O1

void write_cstring(char *s,int length)

{
  byte bVar1;
  uint uVar2;
  byte *pbVar3;
  byte *pbVar4;
  int __c;
  ulong uVar5;
  int iVar6;
  int iVar7;
  
  if (varused_test != 0) {
    varused = 1;
    return;
  }
  putc(0x22,(FILE *)code_file);
  if (0 < length) {
    iVar7 = 1;
    pbVar3 = (byte *)s;
    do {
      pbVar4 = pbVar3 + 1;
      bVar1 = *pbVar3;
      __c = (int)(char)bVar1;
      if (bVar1 < 0x22) {
        switch(bVar1) {
        case 8:
          iVar6 = 0x62;
          break;
        case 9:
          iVar6 = 0x74;
          break;
        case 10:
          iVar6 = 0x6e;
          break;
        default:
          goto switchD_00193880_caseD_b;
        case 0xc:
          iVar6 = 0x66;
          break;
        case 0xd:
          iVar6 = 0x72;
        }
LAB_001938cf:
        if (0x4c < iVar7) {
          fputs("\\\n",(FILE *)code_file);
          iVar7 = 0;
        }
        putc(0x5c,(FILE *)code_file);
        putc(iVar6,(FILE *)code_file);
        iVar7 = iVar7 + 2;
      }
      else {
        iVar6 = __c;
        if (bVar1 < 0x3f) {
          if ((bVar1 != 0x22) && (bVar1 != 0x27)) goto switchD_00193880_caseD_b;
          goto LAB_001938cf;
        }
        if (bVar1 == 0x3f) {
          if ((pbVar3 + -1 < s) || (iVar6 = 0x3f, pbVar3[-1] != 0x3f))
          goto switchD_00193880_caseD_b;
          goto LAB_001938cf;
        }
        if (bVar1 == 0x5c) goto LAB_001938cf;
switchD_00193880_caseD_b:
        if ((byte)(bVar1 - 0x20) < 0x5f) {
          if (0x4d < iVar7) {
            fputs("\\\n",(FILE *)code_file);
            iVar7 = 0;
          }
LAB_00193a8d:
          putc(__c,(FILE *)code_file);
          iVar7 = iVar7 + 1;
        }
        else {
          uVar5 = (ulong)bVar1;
          if (bVar1 < 8) {
            if (0x4b < iVar7) {
              fputs("\\\n",(FILE *)code_file);
              iVar7 = 0;
            }
            fprintf((FILE *)code_file,"\\%o",uVar5);
            iVar7 = iVar7 + 2;
          }
          else if (bVar1 < 0x40) {
            if (0x4a < iVar7) {
              fputs("\\\n",(FILE *)code_file);
              iVar7 = 0;
            }
            fprintf((FILE *)code_file,"\\%o",uVar5);
            iVar7 = iVar7 + 3;
          }
          else {
            if (0x49 < iVar7) {
              fputs("\\\n",(FILE *)code_file);
              iVar7 = 0;
            }
            fprintf((FILE *)code_file,"\\%o",uVar5);
            iVar7 = iVar7 + 4;
          }
          if ((pbVar4 < s + length) &&
             (((byte)(*pbVar4 - 0x30) < 10 ||
              ((uVar2 = *pbVar4 - 0x41, uVar2 < 0x26 &&
               ((0x3f0000003fU >> ((ulong)uVar2 & 0x3f) & 1) != 0)))))) {
            putc(0x22,(FILE *)code_file);
            if (iVar7 < 0x4e) {
              iVar7 = iVar7 + 1;
            }
            else {
              fputs("\n",(FILE *)code_file);
              iVar7 = 0;
            }
            __c = 0x22;
            goto LAB_00193a8d;
          }
        }
      }
      pbVar3 = pbVar4;
    } while (pbVar4 < s + length);
  }
  putc(0x22,(FILE *)code_file);
  return;
}

Assistant:

void write_cstring(const char *s, int length) {
  if (varused_test) {
    varused = 1;
    return;
  }
  const char *p = s;
  const char *e = s+length;
  int linelength = 1;
  putc('\"', code_file);
  for (; p < e;) {
    int c = *p++;
    switch (c) {
    case '\b': c = 'b'; goto QUOTED;
    case '\t': c = 't'; goto QUOTED;
    case '\n': c = 'n'; goto QUOTED;
    case '\f': c = 'f'; goto QUOTED;
    case '\r': c = 'r'; goto QUOTED;
    case '\"':
    case '\'':
    case '\\':
    QUOTED:
      if (linelength >= 77) {fputs("\\\n",code_file); linelength = 0;}
      putc('\\', code_file);
      putc(c, code_file);
      linelength += 2;
      break;
    case '?': // prevent trigraphs by writing ?? as ?\?
      if (p-2 >= s && *(p-2) == '?') goto QUOTED;
      // else fall through:
    default:
      if (c >= ' ' && c < 127) {
	// a legal ASCII character
	if (linelength >= 78) {fputs("\\\n",code_file); linelength = 0;}
	putc(c, code_file);
	linelength++;
	break;
      }
      // otherwise we must print it as an octal constant:
      c &= 255;
      if (c < 8) {
	if (linelength >= 76) {fputs("\\\n",code_file); linelength = 0;}
	fprintf(code_file, "\\%o",c);
	linelength += 2;
      } else if (c < 64) {
	if (linelength >= 75) {fputs("\\\n",code_file); linelength = 0;}
	fprintf(code_file, "\\%o",c);
	linelength += 3;
      } else {
	if (linelength >= 74) {fputs("\\\n",code_file); linelength = 0;}
	fprintf(code_file, "\\%o",c);
	linelength += 4;
      }
      // We must not put more numbers after it, because some C compilers
      // consume them as part of the quoted sequence.  Use string constant
      // pasting to avoid this:
      c = *p;
      if (p < e && ( (c>='0'&&c<='9') || (c>='a'&&c<='f') || (c>='A'&&c<='F') )) {
	putc('\"', code_file); linelength++;
	if (linelength >= 79) {fputs("\n",code_file); linelength = 0;}
	putc('\"', code_file); linelength++;
      }
      break;
    }
  }
  putc('\"', code_file);
}